

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O0

NDArray __thiscall tvm::runtime::TVMPODValue_::operator_cast_to_NDArray(TVMPODValue_ *this)

{
  bool bVar1;
  ostringstream *poVar2;
  ostream *poVar3;
  char *pcVar4;
  undefined8 *in_RSI;
  LogMessageFatal local_1b0;
  anon_enum_32 local_24;
  LogCheckError local_20;
  LogCheckError _check_err;
  TVMPODValue_ *this_local;
  
  if (*(int *)(in_RSI + 1) == 4) {
    NDArray::NDArray((NDArray *)this);
  }
  else {
    local_24 = kNDArrayContainer;
    dmlc::LogCheck_EQ<int,TVMTypeCode>((dmlc *)&local_20,(int *)(in_RSI + 1),&local_24);
    bVar1 = dmlc::LogCheckError::operator_cast_to_bool(&local_20);
    if (bVar1) {
      dmlc::LogMessageFatal::LogMessageFatal
                (&local_1b0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/include/tvm/runtime/packed_func.h"
                 ,0x1d8);
      poVar2 = dmlc::LogMessageFatal::stream_abi_cxx11_(&local_1b0);
      poVar3 = std::operator<<((ostream *)poVar2,"Check failed: ");
      poVar3 = std::operator<<(poVar3,"type_code_ == kNDArrayContainer");
      poVar3 = std::operator<<(poVar3,(string *)local_20.str);
      poVar3 = std::operator<<(poVar3,": ");
      poVar3 = std::operator<<(poVar3," expected ");
      pcVar4 = TypeCode2Str(0xd);
      poVar3 = std::operator<<(poVar3,pcVar4);
      poVar3 = std::operator<<(poVar3," but get ");
      pcVar4 = TypeCode2Str(*(int *)(in_RSI + 1));
      std::operator<<(poVar3,pcVar4);
      dmlc::LogMessageFatal::~LogMessageFatal(&local_1b0);
    }
    dmlc::LogCheckError::~LogCheckError(&local_20);
    NDArray::NDArray((NDArray *)this,(Container *)*in_RSI);
  }
  return (NDArray)(Container *)this;
}

Assistant:

operator NDArray() const {
    if (type_code_ == kNull)
      return NDArray();
    TVM_CHECK_TYPE_CODE(type_code_, kNDArrayContainer);
    return NDArray(static_cast<NDArray::Container *>(value_.v_handle));
  }